

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

unsigned_long_long ZSTD_findDecompressedSize(void *src,size_t srcSize)

{
  ulong uVar1;
  unsigned_long_long uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = 0;
  do {
    if (srcSize < 5) {
      uVar2 = 0xfffffffffffffffe;
      if (srcSize == 0) {
        uVar2 = uVar5;
      }
      return uVar2;
    }
    if ((*src & 0xfffffff0) == 0x184d2a50) {
      if (srcSize < 8) {
        return 0xfffffffffffffffe;
      }
      if (0x1ffffffe < *(uint *)((long)src + 4) >> 3) {
        return 0xfffffffffffffffe;
      }
      uVar1 = (ulong)*(uint *)((long)src + 4) + 8;
      uVar3 = uVar1;
      if (srcSize < uVar1) {
        uVar3 = 0xffffffffffffffb8;
      }
      if (0xffffffffffffff88 < uVar3) {
        return 0xfffffffffffffffe;
      }
      uVar4 = uVar5;
      if (srcSize < uVar3) {
        __assert_fail("skippableSize <= srcSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x9dd3,"unsigned long long ZSTD_findDecompressedSize(const void *, size_t)");
      }
    }
    else {
      uVar2 = ZSTD_getFrameContentSize(src,srcSize);
      if (0xfffffffffffffffd < uVar2) {
        return uVar2;
      }
      uVar4 = uVar2 + uVar5;
      if (uVar2 + uVar5 <= uVar5) {
        uVar4 = uVar5;
      }
      if (CARRY8(uVar2,uVar5)) {
        return 0xfffffffffffffffe;
      }
      uVar1 = ZSTD_findFrameCompressedSize(src,srcSize);
      if (0xffffffffffffff88 < uVar1) {
        return 0xfffffffffffffffe;
      }
      if (srcSize < uVar1) {
        __assert_fail("frameSrcSize <= srcSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x9de4,"unsigned long long ZSTD_findDecompressedSize(const void *, size_t)");
      }
    }
    src = (void *)((long)src + uVar1);
    srcSize = srcSize - uVar1;
    uVar5 = uVar4;
  } while( true );
}

Assistant:

unsigned long long ZSTD_findDecompressedSize(const void* src, size_t srcSize)
{
    unsigned long long totalDstSize = 0;

    while (srcSize >= ZSTD_startingInputLength(ZSTD_f_zstd1)) {
        U32 const magicNumber = MEM_readLE32(src);

        if ((magicNumber & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
            size_t const skippableSize = readSkippableFrameSize(src, srcSize);
            if (ZSTD_isError(skippableSize)) return ZSTD_CONTENTSIZE_ERROR;
            assert(skippableSize <= srcSize);

            src = (const BYTE *)src + skippableSize;
            srcSize -= skippableSize;
            continue;
        }

        {   unsigned long long const fcs = ZSTD_getFrameContentSize(src, srcSize);
            if (fcs >= ZSTD_CONTENTSIZE_ERROR) return fcs;

            if (totalDstSize + fcs < totalDstSize)
                return ZSTD_CONTENTSIZE_ERROR; /* check for overflow */
            totalDstSize += fcs;
        }
        /* skip to next frame */
        {   size_t const frameSrcSize = ZSTD_findFrameCompressedSize(src, srcSize);
            if (ZSTD_isError(frameSrcSize)) return ZSTD_CONTENTSIZE_ERROR;
            assert(frameSrcSize <= srcSize);

            src = (const BYTE *)src + frameSrcSize;
            srcSize -= frameSrcSize;
        }
    }  /* while (srcSize >= ZSTD_frameHeaderSize_prefix) */

    if (srcSize) return ZSTD_CONTENTSIZE_ERROR;

    return totalDstSize;
}